

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::ModuleFor<flatbuffers::EnumDef>
          (string *__return_storage_ptr__,PythonGenerator *this,EnumDef *def)

{
  __type _Var1;
  char local_aa [2];
  char *local_a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_95;
  undefined4 local_94;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string filename;
  EnumDef *def_local;
  PythonGenerator *this_local;
  string *module;
  
  filename.field_2._8_8_ = def;
  if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
    IdlNamer::NamespacedType_abi_cxx11_(__return_storage_ptr__,&this->namer_,&def->super_Definition)
    ;
  }
  else {
    StripExtension(&local_60,&(def->super_Definition).file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
    std::__cxx11::string::~string((string *)&local_60);
    _Var1 = std::operator==(&((this->super_BaseGenerator).parser_)->file_being_parsed_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (filename.field_2._8_8_ + 0x20));
    if (_Var1) {
      StripPath(&local_90,(string *)local_40);
      std::operator+(__return_storage_ptr__,".",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      local_95 = 0;
      std::operator+(__return_storage_ptr__,
                     &(((this->super_BaseGenerator).parser_)->opts).include_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      local_a0._M_current = (char *)std::__cxx11::string::begin();
      local_a8 = (char *)std::__cxx11::string::end();
      local_aa[1] = 0x2f;
      local_aa[0] = '.';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_a0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           )local_a8,local_aa + 1,local_aa);
      local_95 = 1;
    }
    local_94 = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleFor(const T *def) const {
    if (!parser_.opts.one_file) {
      return namer_.NamespacedType(*def);
    }

    std::string filename =
        StripExtension(def->file) + parser_.opts.filename_suffix;
    if (parser_.file_being_parsed_ == def->file) {
      return "." + StripPath(filename);  // make it a "local" import
    }

    std::string module = parser_.opts.include_prefix + filename;
    std::replace(module.begin(), module.end(), '/', '.');
    return module;
  }